

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O3

void __thiscall
duckdb::Serializer::
WritePropertyWithDefault<duckdb::unique_ptr<duckdb::BoundOrderModifier,std::default_delete<duckdb::BoundOrderModifier>,true>>
          (Serializer *this,field_id_t field_id,char *tag,
          unique_ptr<duckdb::BoundOrderModifier,_std::default_delete<duckdb::BoundOrderModifier>,_true>
          *value,unique_ptr<duckdb::BoundOrderModifier,_std::default_delete<duckdb::BoundOrderModifier>,_true>
                 *default_value)

{
  byte bVar1;
  
  if (((this->options).serialize_default_values == false) &&
     ((value->
      super_unique_ptr<duckdb::BoundOrderModifier,_std::default_delete<duckdb::BoundOrderModifier>_>
      )._M_t.
      super___uniq_ptr_impl<duckdb::BoundOrderModifier,_std::default_delete<duckdb::BoundOrderModifier>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::BoundOrderModifier_*,_std::default_delete<duckdb::BoundOrderModifier>_>
      .super__Head_base<0UL,_duckdb::BoundOrderModifier_*,_false>._M_head_impl ==
      (default_value->
      super_unique_ptr<duckdb::BoundOrderModifier,_std::default_delete<duckdb::BoundOrderModifier>_>
      )._M_t.
      super___uniq_ptr_impl<duckdb::BoundOrderModifier,_std::default_delete<duckdb::BoundOrderModifier>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::BoundOrderModifier_*,_std::default_delete<duckdb::BoundOrderModifier>_>
      .super__Head_base<0UL,_duckdb::BoundOrderModifier_*,_false>._M_head_impl)) {
    bVar1 = 0;
    (*this->_vptr_Serializer[4])(this,field_id,tag,0);
  }
  else {
    (*this->_vptr_Serializer[4])(this,field_id,tag,1);
    WriteValue<duckdb::BoundOrderModifier>
              (this,(value->
                    super_unique_ptr<duckdb::BoundOrderModifier,_std::default_delete<duckdb::BoundOrderModifier>_>
                    )._M_t.
                    super___uniq_ptr_impl<duckdb::BoundOrderModifier,_std::default_delete<duckdb::BoundOrderModifier>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_duckdb::BoundOrderModifier_*,_std::default_delete<duckdb::BoundOrderModifier>_>
                    .super__Head_base<0UL,_duckdb::BoundOrderModifier_*,_false>._M_head_impl);
    bVar1 = 1;
  }
  (*this->_vptr_Serializer[5])(this,(ulong)bVar1);
  return;
}

Assistant:

void WritePropertyWithDefault(const field_id_t field_id, const char *tag, const T &value, const T &default_value) {
		// If current value is default, don't write it
		if (!options.serialize_default_values && (value == default_value)) {
			OnOptionalPropertyBegin(field_id, tag, false);
			OnOptionalPropertyEnd(false);
			return;
		}
		OnOptionalPropertyBegin(field_id, tag, true);
		WriteValue(value);
		OnOptionalPropertyEnd(true);
	}